

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

CURLcode Curl_xfer_send(Curl_easy *data,void *buf,size_t blen,_Bool eos,size_t *pnwritten)

{
  curl_off_t *pcVar1;
  int iVar2;
  CURLcode CVar3;
  uint sockindex;
  
  iVar2 = data->conn->writesockfd;
  sockindex = 0;
  if (iVar2 != -1) {
    sockindex = (uint)(iVar2 == data->conn->sock[1]);
  }
  CVar3 = Curl_conn_send(data,sockindex,buf,blen,eos,pnwritten);
  if (CVar3 == CURLE_OK) {
    CVar3 = CURLE_OK;
    if (*pnwritten != 0) {
      pcVar1 = &(data->info).request_size;
      *pcVar1 = *pcVar1 + *pnwritten;
      CVar3 = CURLE_OK;
    }
  }
  else if (CVar3 == CURLE_AGAIN) {
    *pnwritten = 0;
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

CURLcode Curl_xfer_send(struct Curl_easy *data,
                        const void *buf, size_t blen, bool eos,
                        size_t *pnwritten)
{
  CURLcode result;
  int sockindex;

  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);

  sockindex = ((data->conn->writesockfd != CURL_SOCKET_BAD) &&
               (data->conn->writesockfd == data->conn->sock[SECONDARYSOCKET]));
  result = Curl_conn_send(data, sockindex, buf, blen, eos, pnwritten);
  if(result == CURLE_AGAIN) {
    result = CURLE_OK;
    *pnwritten = 0;
  }
  else if(!result && *pnwritten)
    data->info.request_size += *pnwritten;

  DEBUGF(infof(data, "Curl_xfer_send(len=%zu, eos=%d) -> %d, %zu",
               blen, eos, result, *pnwritten));
  return result;
}